

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppc.c
# Opt level: O0

target_ulong cpu_ppc_load_decr_ppc(CPUPPCState_conflict *env)

{
  ulong uVar1;
  uint64_t decr;
  ppc_tb_t *tb_env;
  CPUPPCState_conflict *env_local;
  
  uVar1 = _cpu_ppc_load_decr(env,env->tb_env->decr_next);
  return uVar1 & 0xffffffff;
}

Assistant:

target_ulong cpu_ppc_load_decr(CPUPPCState *env)
{
    ppc_tb_t *tb_env = env->tb_env;
    uint64_t decr;

#if 0
    if (kvm_enabled()) {
        return env->spr[SPR_DECR];
    }
#endif

    decr = _cpu_ppc_load_decr(env, tb_env->decr_next);

    /*
     * If large decrementer is enabled then the decrementer is signed extened
     * to 64 bits, otherwise it is a 32 bit value.
     */
    if (env->spr[SPR_LPCR] & LPCR_LD) {
        return decr;
    }
    return (uint32_t) decr;
}